

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.h
# Opt level: O1

DrawableList __thiscall rlottie::internal::renderer::SolidLayer::renderList(SolidLayer *this)

{
  int iVar1;
  Layer *pLVar2;
  VDrawable **ppVVar3;
  index_type iVar4;
  DrawableList DVar5;
  
  iVar1 = (this->super_Layer).mFrameNo;
  pLVar2 = (this->super_Layer).mLayerData;
  ppVVar3 = (VDrawable **)0x0;
  iVar4 = 0;
  if (pLVar2->mInFrame <= iVar1) {
    ppVVar3 = (VDrawable **)0x0;
    iVar4 = 0;
    if (iVar1 <= pLVar2->mOutFrame) {
      ppVVar3 = (VDrawable **)0x0;
      iVar4 = 0;
      if (1e-06 < ABS((this->super_Layer).mCombinedAlpha)) {
        ppVVar3 = &this->mDrawableList;
        iVar4 = 1;
      }
    }
  }
  DVar5._size = iVar4;
  DVar5._data = ppVVar3;
  return DVar5;
}

Assistant:

inline int     frameNo() const { return mFrameNo; }